

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_mutex_t mutex;
  uv_buf_t uStack_148;
  code *pcStack_138;
  long lStack_130;
  long lStack_128;
  sockaddr_in sStack_120;
  uv_cond_t *puStack_110;
  long lStack_108;
  long lStack_100;
  uv_rwlock_t *puStack_f8;
  uv_thread_t uStack_b0;
  uv_rwlock_t *puStack_a8;
  undefined8 uStack_98;
  long lStack_90;
  uv_rwlock_t uStack_88;
  uv_rwlock_t *puStack_50;
  undefined8 local_40;
  long local_38;
  
  puStack_50 = (uv_rwlock_t *)0x1aa99a;
  iVar1 = uv_mutex_init_recursive((uv_mutex_t *)&stack0xffffffffffffffd0);
  local_38 = (long)iVar1;
  local_40 = 0;
  if (local_38 == 0) {
    unaff_RBX = (uv_rwlock_t *)&stack0xffffffffffffffd0;
    puStack_50 = (uv_rwlock_t *)0x1aa9c3;
    uv_mutex_lock((uv_mutex_t *)unaff_RBX);
    puStack_50 = (uv_rwlock_t *)0x1aa9cb;
    uv_mutex_lock((uv_mutex_t *)unaff_RBX);
    puStack_50 = (uv_rwlock_t *)0x1aa9d3;
    iVar1 = uv_mutex_trylock((uv_mutex_t *)unaff_RBX);
    local_38 = (long)iVar1;
    local_40 = 0;
    if (local_38 == 0) {
      puStack_50 = (uv_rwlock_t *)0x1aa9fc;
      uv_mutex_unlock((uv_mutex_t *)&stack0xffffffffffffffd0);
      puStack_50 = (uv_rwlock_t *)0x1aaa04;
      uv_mutex_unlock((uv_mutex_t *)&stack0xffffffffffffffd0);
      puStack_50 = (uv_rwlock_t *)0x1aaa0c;
      uv_mutex_unlock((uv_mutex_t *)&stack0xffffffffffffffd0);
      puStack_50 = (uv_rwlock_t *)0x1aaa14;
      uv_mutex_destroy((uv_mutex_t *)&stack0xffffffffffffffd0);
      return 0;
    }
  }
  else {
    puStack_50 = (uv_rwlock_t *)0x1aaa2b;
    run_test_thread_mutex_recursive_cold_1();
  }
  puStack_50 = (uv_rwlock_t *)run_test_thread_rwlock;
  run_test_thread_mutex_recursive_cold_2();
  puStack_a8 = (uv_rwlock_t *)0x1aaa49;
  puStack_50 = unaff_RBX;
  iVar1 = uv_rwlock_init(&uStack_88);
  lStack_90 = (long)iVar1;
  uStack_98 = 0;
  if (lStack_90 == 0) {
    puStack_a8 = (uv_rwlock_t *)0x1aaa72;
    uv_rwlock_rdlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aaa7a;
    uv_rwlock_rdunlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aaa82;
    uv_rwlock_wrlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aaa8a;
    uv_rwlock_wrunlock(&uStack_88);
    puStack_a8 = (uv_rwlock_t *)0x1aaa92;
    uv_rwlock_destroy(&uStack_88);
    return 0;
  }
  puStack_a8 = (uv_rwlock_t *)run_test_thread_rwlock_trylock;
  run_test_thread_rwlock_cold_1();
  puStack_a8 = unaff_RBX;
  iVar1 = uv_cond_init(&condvar);
  uStack_b0 = (uv_thread_t)iVar1;
  if (uStack_b0 == 0) {
    iVar1 = uv_mutex_init(&::mutex);
    uStack_b0 = (uv_thread_t)iVar1;
    if (uStack_b0 != 0) goto LAB_001aad23;
    iVar1 = uv_rwlock_init(&rwlock);
    uStack_b0 = (uv_thread_t)iVar1;
    if (uStack_b0 != 0) goto LAB_001aad32;
    uv_mutex_lock(&::mutex);
    iVar1 = uv_thread_create(&uStack_b0,thread_rwlock_trylock_peer,(void *)0x0);
    if (iVar1 != 0) goto LAB_001aad41;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aad50;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aad5f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aad6e;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aad7d;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aad8c;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aad9b;
    synchronize();
    iVar1 = uv_thread_join(&uStack_b0);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&::mutex);
      uv_mutex_destroy(&::mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001aad23:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001aad32:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001aad41:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001aad50:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001aad5f:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001aad6e:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001aad7d:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001aad8c:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001aad9b:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&::mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aaf28;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aaf35;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001aaf42;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001aaf4f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      uv_mutex_unlock(&::mutex);
      return extraout_EAX;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001aaf28:
    thread_rwlock_trylock_peer_cold_2();
LAB_001aaf35:
    thread_rwlock_trylock_peer_cold_3();
LAB_001aaf42:
    thread_rwlock_trylock_peer_cold_4();
LAB_001aaf4f:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_110 = (uv_cond_t *)0x1aaf87;
  puStack_f8 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_108 = (long)step;
  do {
    puStack_110 = (uv_cond_t *)0x1aafa0;
    uv_cond_wait(&condvar,&::mutex);
    lStack_100 = (long)step;
  } while (iVar1 == step);
  lStack_108 = lStack_108 + 1;
  if (lStack_100 == lStack_108) {
    return step;
  }
  puStack_110 = (uv_cond_t *)0x1aafda;
  synchronize_cold_1();
  puStack_110 = &condvar;
  iVar2 = (int)&lStack_130;
  pcStack_138 = (code *)0x1aaff7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_120);
  lStack_128 = (long)iVar1;
  lStack_130 = 0;
  if (lStack_128 == 0) {
    pcStack_138 = (code *)0x1ab021;
    iVar1 = uv_loop_init(&loop);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab1c7;
    pcStack_138 = (code *)0x1ab052;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab1d4;
    pcStack_138 = (code *)0x1ab08f;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,(sockaddr *)&sStack_120,connect_cb);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab1e1;
    pcStack_138 = (code *)0x1ab0bb;
    iVar1 = uv_run(&loop,UV_RUN_DEFAULT);
    lStack_128 = (long)iVar1;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001ab1ee;
    lStack_128 = 1;
    lStack_130 = (long)connect_cb_called;
    if (lStack_130 != 1) goto LAB_001ab1fb;
    lStack_128 = 1;
    lStack_130 = (long)read_cb_called;
    if (lStack_130 != 1) goto LAB_001ab208;
    lStack_128 = 1;
    lStack_130 = (long)write_cb_called;
    if (lStack_130 != 1) goto LAB_001ab215;
    lStack_128 = 1;
    lStack_130 = (long)close_cb_called;
    if (lStack_130 != 1) goto LAB_001ab222;
    pcStack_138 = (code *)0x1ab17d;
    uv_walk(&loop,close_walk_cb,(void *)0x0);
    pcStack_138 = (code *)0x1ab187;
    uv_run(&loop,UV_RUN_DEFAULT);
    lStack_128 = 0;
    pcStack_138 = (code *)0x1ab198;
    iVar1 = uv_loop_close(&loop);
    lStack_130 = (long)iVar1;
    if (lStack_128 == lStack_130) {
      pcStack_138 = (code *)0x1ab1b2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_138 = (code *)0x1ab1c7;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001ab1c7:
    pcStack_138 = (code *)0x1ab1d4;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001ab1d4:
    pcStack_138 = (code *)0x1ab1e1;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001ab1e1:
    pcStack_138 = (code *)0x1ab1ee;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001ab1ee:
    pcStack_138 = (code *)0x1ab1fb;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001ab1fb:
    pcStack_138 = (code *)0x1ab208;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001ab208:
    pcStack_138 = (code *)0x1ab215;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001ab215:
    pcStack_138 = (code *)0x1ab222;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001ab222:
    pcStack_138 = (code *)0x1ab22f;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_138 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  uStack_148.base = (char *)(long)iVar2;
  if ((char *)(long)iVar2 == (char *)0x0) {
    iVar1 = uv_read_start((uv_stream_t *)&tcp_client,alloc_cb,read_cb);
    uStack_148.base = (char *)(long)iVar1;
    if ((char *)(long)iVar1 == (char *)0x0) {
      uStack_148 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_client,&uStack_148,1,write_cb);
      pcStack_138 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001ab31b;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001ab31b:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x3893e0;
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT_OK(r);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}